

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topic_manager.cpp
# Opt level: O3

void __thiscall miniros::TopicManager::getBusStats(TopicManager *this,XmlRpcValue *stats)

{
  list<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
  *plVar1;
  pointer psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  XmlRpcValue *pXVar5;
  XmlRpcValue *pXVar6;
  _List_node_base *p_Var7;
  pointer psVar8;
  XmlRpcValue subscribe_stats;
  XmlRpcValue service_stats;
  XmlRpcValue publish_stats;
  XmlRpcValue local_80;
  pthread_mutex_t *local_70;
  XmlRpcValue local_68;
  XmlRpcValue local_58;
  XmlRpcValue *local_48;
  
  local_58._type = TypeInvalid;
  local_58._value.asDouble = 0.0;
  local_80._type = TypeInvalid;
  local_80._value.asDouble = 0.0;
  local_68._type = TypeInvalid;
  local_68._value.asDouble = 0.0;
  XmlRpc::XmlRpcValue::assertArray
            (&local_58,
             (int)((ulong)((long)(this->advertised_topics_).
                                 super__Vector_base<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->advertised_topics_).
                                super__Vector_base<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4));
  XmlRpc::XmlRpcValue::assertArray
            (&local_80,
             (int)(this->subscriptions_).
                  super__List_base<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
                  ._M_impl._M_node._M_size);
  XmlRpc::XmlRpcValue::assertArray(&local_68,0);
  local_70 = (pthread_mutex_t *)&this->advertised_topics_mutex_;
  iVar4 = pthread_mutex_lock(local_70);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  psVar8 = (this->advertised_topics_).
           super__Vector_base<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->advertised_topics_).
           super__Vector_base<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_48 = stats;
  if (psVar8 != psVar2) {
    iVar4 = 0;
    do {
      p_Var3 = (psVar8->super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      Publication::getStats((Publication *)&stack0xffffffffffffffc0);
      pXVar5 = XmlRpc::XmlRpcValue::operator[](&local_58,iVar4);
      XmlRpc::XmlRpcValue::operator=(pXVar5,(XmlRpcValue *)&stack0xffffffffffffffc0);
      XmlRpc::XmlRpcValue::invalidate((XmlRpcValue *)&stack0xffffffffffffffc0);
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      psVar8 = psVar8 + 1;
      iVar4 = iVar4 + 1;
    } while (psVar8 != psVar2);
  }
  pthread_mutex_unlock(local_70);
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar4 == 0) {
    plVar1 = &this->subscriptions_;
    p_Var7 = (plVar1->
             super__List_base<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var7 != (_List_node_base *)plVar1) {
      iVar4 = 0;
      do {
        p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7[1]._M_prev;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        Subscription::getStats((Subscription *)&stack0xffffffffffffffc0);
        pXVar5 = XmlRpc::XmlRpcValue::operator[](&local_80,iVar4);
        XmlRpc::XmlRpcValue::operator=(pXVar5,(XmlRpcValue *)&stack0xffffffffffffffc0);
        XmlRpc::XmlRpcValue::invalidate((XmlRpcValue *)&stack0xffffffffffffffc0);
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        p_Var7 = p_Var7->_M_next;
        iVar4 = iVar4 + 1;
      } while (p_Var7 != (_List_node_base *)plVar1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    pXVar5 = local_48;
    pXVar6 = XmlRpc::XmlRpcValue::operator[](local_48,0);
    XmlRpc::XmlRpcValue::operator=(pXVar6,&local_58);
    pXVar6 = XmlRpc::XmlRpcValue::operator[](pXVar5,1);
    XmlRpc::XmlRpcValue::operator=(pXVar6,&local_80);
    pXVar5 = XmlRpc::XmlRpcValue::operator[](pXVar5,2);
    XmlRpc::XmlRpcValue::operator=(pXVar5,&local_68);
    XmlRpc::XmlRpcValue::invalidate(&local_68);
    XmlRpc::XmlRpcValue::invalidate(&local_80);
    XmlRpc::XmlRpcValue::invalidate(&local_58);
    return;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

void TopicManager::getBusStats(XmlRpcValue& stats)
{
  XmlRpcValue publish_stats, subscribe_stats, service_stats;
  // force these guys to be arrays, even if we don't populate them
  publish_stats.setSize(advertised_topics_.size());
  subscribe_stats.setSize(subscriptions_.size());
  service_stats.setSize(0);

  {
    uint32_t pidx = 0;
    std::scoped_lock<std::recursive_mutex> lock(advertised_topics_mutex_);
    for (PublicationPtr t: advertised_topics_)
      publish_stats[pidx++] = t->getStats();
  }

  {
    uint32_t sidx = 0;
    std::scoped_lock<std::mutex> lock(subs_mutex_);
    for (SubscriptionPtr t: subscriptions_)
      subscribe_stats[sidx++] = t->getStats();
  }

  stats[0] = publish_stats;
  stats[1] = subscribe_stats;
  stats[2] = service_stats;
}